

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall Fifteen::slotSaveBoard(Fifteen *this)

{
  Controller *this_00;
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QArrayDataPointer<char16_t> local_98;
  string local_78;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  
  QString::QString((QString *)&local_98,(char *)0x0);
  QString::QString((QString *)&local_40,"");
  QDir::currentPath();
  local_28.d = (Data *)0x0;
  local_28.ptr = (char16_t *)0x0;
  local_28.size = 0;
  QFileDialog::getSaveFileName(&local_78,this,&local_40,&local_58,&local_28,0,0);
  qVar3 = local_98.size;
  pcVar2 = local_98.ptr;
  pDVar1 = local_98.d;
  local_98.d = (Data *)local_78._M_dataplus._M_p;
  local_98.ptr = (char16_t *)local_78._M_string_length;
  local_78._M_dataplus._M_p = (pointer)pDVar1;
  local_78._M_string_length = (size_type)pcVar2;
  local_98.size = local_78.field_2._M_allocated_capacity;
  local_78.field_2._M_allocated_capacity = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (local_98.size != 0) {
    this_00 = (this->controller)._M_t.
              super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
              super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
              super__Head_base<0UL,_Controller_*,_false>._M_head_impl;
    QString::toStdString_abi_cxx11_(&local_78,(QString *)&local_98);
    Controller::writeBoardIntoFile(this_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  return;
}

Assistant:

void Fifteen::slotSaveBoard()
{
    QString file = nullptr;
    if ( file = QFileDialog::getSaveFileName( this, "", QDir::currentPath() );
         file.isEmpty() )
    {
        return;
    }
    controller->writeBoardIntoFile( file.toStdString() );
}